

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int mbedtls_ecp_check_privkey(mbedtls_ecp_group *grp,mbedtls_mpi *d)

{
  ecp_curve_type eVar1;
  int iVar2;
  size_t sVar3;
  mbedtls_mpi *d_local;
  mbedtls_ecp_group *grp_local;
  
  eVar1 = ecp_get_type(grp);
  if (eVar1 == ECP_TYPE_MONTGOMERY) {
    iVar2 = mbedtls_mpi_get_bit(d,0);
    if ((((iVar2 == 0) && (iVar2 = mbedtls_mpi_get_bit(d,1), iVar2 == 0)) &&
        (iVar2 = mbedtls_mpi_get_bit(d,2), iVar2 == 0)) &&
       (sVar3 = mbedtls_mpi_bitlen(d), sVar3 - 1 == grp->nbits)) {
      return 0;
    }
    grp_local._4_4_ = -0x4c80;
  }
  else {
    eVar1 = ecp_get_type(grp);
    if (eVar1 == ECP_TYPE_SHORT_WEIERSTRASS) {
      iVar2 = mbedtls_mpi_cmp_int(d,1);
      if ((-1 < iVar2) && (iVar2 = mbedtls_mpi_cmp_mpi(d,&grp->N), iVar2 < 0)) {
        return 0;
      }
      grp_local._4_4_ = -0x4c80;
    }
    else {
      grp_local._4_4_ = -0x4f80;
    }
  }
  return grp_local._4_4_;
}

Assistant:

int mbedtls_ecp_check_privkey( const mbedtls_ecp_group *grp, const mbedtls_mpi *d )
{
#if defined(ECP_MONTGOMERY)
    if( ecp_get_type( grp ) == ECP_TYPE_MONTGOMERY )
    {
        /* see [Curve25519] page 5 */
        if( mbedtls_mpi_get_bit( d, 0 ) != 0 ||
            mbedtls_mpi_get_bit( d, 1 ) != 0 ||
            mbedtls_mpi_get_bit( d, 2 ) != 0 ||
            mbedtls_mpi_bitlen( d ) - 1 != grp->nbits ) /* mbedtls_mpi_bitlen is one-based! */
            return( MBEDTLS_ERR_ECP_INVALID_KEY );
        else
            return( 0 );
    }
#endif /* ECP_MONTGOMERY */
#if defined(ECP_SHORTWEIERSTRASS)
    if( ecp_get_type( grp ) == ECP_TYPE_SHORT_WEIERSTRASS )
    {
        /* see SEC1 3.2 */
        if( mbedtls_mpi_cmp_int( d, 1 ) < 0 ||
            mbedtls_mpi_cmp_mpi( d, &grp->N ) >= 0 )
            return( MBEDTLS_ERR_ECP_INVALID_KEY );
        else
            return( 0 );
    }
#endif /* ECP_SHORTWEIERSTRASS */

    return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );
}